

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.h
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionShapeCircular::~ChBeamSectionShapeCircular
          (ChBeamSectionShapeCircular *this)

{
  ~ChBeamSectionShapeCircular(this);
  ::operator_delete(this,0x48);
  return;
}

Assistant:

class ChApi ChBeamSectionShapeCircular : public ChBeamSectionShape {
  public:
    ChBeamSectionShapeCircular(double mradius, int mresolution = 10) {
        radius = mradius;
        resolution = mresolution;
        this->UpdateProfile();
    }

    //
    // Functions for drawing the shape via triangulation:
    //

    virtual int GetNofLines() const override { return 1; };

    virtual int GetNofPoints(const int i_line) const override { return resolution + 1; };

    /// Compute the points (in the reference of the section).
    /// Note: mpoints must already have the proper size.
    virtual void GetPoints(const int i_line, std::vector<ChVector<>>& mpoints) const override { mpoints = points; };

    /// Compute the normals (in the reference of the section) at each point.
    /// Note: mnormals must already have the proper size.
    virtual void GetNormals(const int i_line, std::vector<ChVector<>>& mnormals) const override { mnormals = normals; }

    //
    // Functions for drawing, optimizations, collisions
    //

    /// Returns the axis-aligned bounding box (assuming axes of local reference of the section)
    /// This functions has many uses, ex.for drawing, optimizations, collisions.
    virtual void GetAABB(double& ymin, double& ymax, double& zmin, double& zmax) const override;

  private:
    // internal: update internal precomputed vertex arrays
    void UpdateProfile();

    int resolution;
    double radius;
    std::vector<ChVector<>> points;
    std::vector<ChVector<>> normals;
}